

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArchiveWrite.cxx
# Opt level: O3

bool __thiscall cmArchiveWrite::AddData(cmArchiveWrite *this,char *file,size_t size)

{
  size_t sVar1;
  string *psVar2;
  bool bVar3;
  size_t s;
  ifstream fin;
  char buffer [16384];
  string local_4268;
  char *local_4248;
  long local_4240;
  size_t local_4238;
  byte abStack_4220 [488];
  size_type *local_4038 [2];
  size_type local_4028 [2047];
  
  std::ifstream::ifstream(&local_4240,file,_S_in|_S_bin);
  if ((abStack_4220[*(long *)(local_4240 + -0x18)] & 5) == 0) {
    bVar3 = true;
    if (size != 0) {
      local_4248 = file;
      do {
        s = 0x4000;
        if (size < 0x4000) {
          s = size;
        }
        std::istream::read((char *)&local_4240,(long)local_4038);
        if (local_4238 != s) {
          psVar2 = &this->Error;
          std::__cxx11::string::_M_replace
                    ((ulong)psVar2,0,(char *)(this->Error)._M_string_length,0x1c6b2c);
          std::__cxx11::string::append((char *)psVar2);
          std::__cxx11::string::append((char *)psVar2);
          cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
          std::__cxx11::string::_M_append((char *)psVar2,(ulong)local_4268._M_dataplus._M_p);
LAB_0011a82b:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4268._M_dataplus._M_p != &local_4268.field_2) goto LAB_0011a83e;
          goto LAB_0011a846;
        }
        sVar1 = archive_write_data(this->Archive,local_4038,s);
        if (sVar1 != s) {
          std::__cxx11::string::_M_replace
                    ((ulong)&this->Error,0,(char *)(this->Error)._M_string_length,0x1c6b17);
          cm_archive_error_string_abi_cxx11_(&local_4268,this->Archive);
          std::__cxx11::string::_M_append((char *)&this->Error,(ulong)local_4268._M_dataplus._M_p);
          goto LAB_0011a82b;
        }
        size = size - s;
      } while (size != 0);
    }
  }
  else {
    psVar2 = &this->Error;
    std::__cxx11::string::_M_replace
              ((ulong)psVar2,0,(char *)(this->Error)._M_string_length,0x1c6b07);
    std::__cxx11::string::append((char *)psVar2);
    std::__cxx11::string::append((char *)psVar2);
    cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
    std::__cxx11::string::_M_append((char *)psVar2,(ulong)local_4038[0]);
    local_4268.field_2._M_allocated_capacity = local_4028[0];
    local_4268._M_dataplus._M_p = (pointer)local_4038[0];
    if (local_4038[0] != local_4028) {
LAB_0011a83e:
      operator_delete(local_4268._M_dataplus._M_p,local_4268.field_2._M_allocated_capacity + 1);
    }
LAB_0011a846:
    bVar3 = false;
  }
  std::ifstream::~ifstream(&local_4240);
  return bVar3;
}

Assistant:

bool cmArchiveWrite::AddData(const char* file, size_t size)
{
  cmsys::ifstream fin(file, std::ios::in | std::ios::binary);
  if (!fin) {
    this->Error = "Error opening \"";
    this->Error += file;
    this->Error += "\": ";
    this->Error += cmSystemTools::GetLastSystemError();
    return false;
  }

  char buffer[16384];
  size_t nleft = size;
  while (nleft > 0) {
    typedef std::streamsize ssize_type;
    size_t const nnext = nleft > sizeof(buffer) ? sizeof(buffer) : nleft;
    ssize_type const nnext_s = static_cast<ssize_type>(nnext);
    fin.read(buffer, nnext_s);
    // Some stream libraries (older HPUX) return failure at end of
    // file on the last read even if some data were read.  Check
    // gcount instead of trusting the stream error status.
    if (static_cast<size_t>(fin.gcount()) != nnext) {
      break;
    }
    if (archive_write_data(this->Archive, buffer, nnext) != nnext_s) {
      this->Error = "archive_write_data: ";
      this->Error += cm_archive_error_string(this->Archive);
      return false;
    }
    nleft -= nnext;
  }
  if (nleft > 0) {
    this->Error = "Error reading \"";
    this->Error += file;
    this->Error += "\": ";
    this->Error += cmSystemTools::GetLastSystemError();
    return false;
  }
  return true;
}